

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict2pid.c
# Opt level: O1

void dict2pid_dump(FILE *fp,dict2pid_t *d2p,mdef_t *mdef,dict_t *dict)

{
  ushort uVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  
  fwrite("# INTERNAL (wd comssid ssid ssid ... ssid comssid)\n",0x33,1,(FILE *)fp);
  if (0 < dict->n_word) {
    lVar5 = 0;
    do {
      fprintf((FILE *)fp,"%30s ",dict->word[lVar5].word);
      lVar7 = (long)dict->word[lVar5].pronlen;
      if (0 < lVar7) {
        lVar8 = 0;
        do {
          fprintf((FILE *)fp," %5d",(ulong)(uint)d2p->internal[lVar5][lVar8]);
          lVar8 = lVar8 + 1;
        } while (lVar7 != lVar8);
      }
      fputc(10,(FILE *)fp);
      lVar5 = lVar5 + 1;
    } while (lVar5 < dict->n_word);
  }
  fwrite("#\n",2,1,(FILE *)fp);
  fwrite("# LDIPH_LC (b r l ssid)\n",0x18,1,(FILE *)fp);
  if (0 < mdef->n_ciphone) {
    lVar5 = 0;
    do {
      if (0 < mdef->n_ciphone) {
        lVar7 = 0;
        do {
          if (0 < mdef->n_ciphone) {
            lVar8 = 0;
            do {
              if (-1 < d2p->ldiph_lc[lVar5][lVar7][lVar8]) {
                pcVar2 = mdef_ciphone_str(mdef,(s3cipid_t)lVar5);
                pcVar3 = mdef_ciphone_str(mdef,(s3cipid_t)lVar7);
                pcVar4 = mdef_ciphone_str(mdef,(s3cipid_t)lVar8);
                fprintf((FILE *)fp,"%6s %6s %6s %5d\n",pcVar2,pcVar3,pcVar4,
                        (ulong)(uint)d2p->ldiph_lc[lVar5][lVar7][lVar8]);
              }
              lVar8 = lVar8 + 1;
            } while (lVar8 < mdef->n_ciphone);
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < mdef->n_ciphone);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < mdef->n_ciphone);
  }
  fwrite("#\n",2,1,(FILE *)fp);
  fwrite("# SINGLE_LC (b l comssid)\n",0x1a,1,(FILE *)fp);
  if (0 < mdef->n_ciphone) {
    lVar5 = 0;
    do {
      if (0 < mdef->n_ciphone) {
        lVar7 = 0;
        do {
          if (-1 < d2p->single_lc[lVar5][lVar7]) {
            pcVar2 = mdef_ciphone_str(mdef,(s3cipid_t)lVar5);
            pcVar3 = mdef_ciphone_str(mdef,(s3cipid_t)lVar7);
            fprintf((FILE *)fp,"%6s %6s %5d\n",pcVar2,pcVar3,
                    (ulong)(uint)d2p->single_lc[lVar5][lVar7]);
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < mdef->n_ciphone);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < mdef->n_ciphone);
  }
  fwrite("#\n",2,1,(FILE *)fp);
  fprintf((FILE *)fp,"# SSEQ %d (senid senid ...)\n",(ulong)(uint)mdef->n_sseq);
  if (0 < mdef->n_sseq) {
    uVar6 = 0;
    do {
      fprintf((FILE *)fp,"%5d ",uVar6 & 0xffffffff);
      if (0 < mdef->n_emit_state) {
        lVar5 = 0;
        do {
          fprintf((FILE *)fp," %5d",(ulong)(uint)(int)mdef->sseq[uVar6][lVar5]);
          lVar5 = lVar5 + 1;
        } while (lVar5 < mdef->n_emit_state);
      }
      fputc(10,(FILE *)fp);
      uVar6 = uVar6 + 1;
    } while ((long)uVar6 < (long)mdef->n_sseq);
  }
  fwrite("#\n",2,1,(FILE *)fp);
  fprintf((FILE *)fp,"# COMSSEQ %d (comstate comstate ...)\n",(ulong)(uint)d2p->n_comsseq);
  if (0 < d2p->n_comsseq) {
    uVar6 = 0;
    do {
      fprintf((FILE *)fp,"%5d ",uVar6 & 0xffffffff);
      if (0 < mdef->n_emit_state) {
        lVar5 = 0;
        do {
          fprintf((FILE *)fp," %5d",(ulong)(uint)(int)d2p->comsseq[uVar6][lVar5]);
          lVar5 = lVar5 + 1;
        } while (lVar5 < mdef->n_emit_state);
      }
      fputc(10,(FILE *)fp);
      uVar6 = uVar6 + 1;
    } while ((long)uVar6 < (long)d2p->n_comsseq);
  }
  fwrite("#\n",2,1,(FILE *)fp);
  fprintf((FILE *)fp,"# COMSTATE %d (senid senid ...)\n",(ulong)(uint)d2p->n_comstate);
  if (0 < d2p->n_comstate) {
    uVar6 = 0;
    do {
      fprintf((FILE *)fp,"%5d ",uVar6 & 0xffffffff);
      uVar1 = *d2p->comstate[uVar6];
      if (-1 < (short)uVar1) {
        lVar5 = 2;
        do {
          fprintf((FILE *)fp," %5d",(ulong)uVar1);
          uVar1 = *(ushort *)((long)d2p->comstate[uVar6] + lVar5);
          lVar5 = lVar5 + 2;
        } while (-1 < (short)uVar1);
      }
      fputc(10,(FILE *)fp);
      uVar6 = uVar6 + 1;
    } while ((long)uVar6 < (long)d2p->n_comstate);
  }
  fwrite("#\n",2,1,(FILE *)fp);
  fwrite("# END\n",6,1,(FILE *)fp);
  fflush((FILE *)fp);
  return;
}

Assistant:

void
dict2pid_dump(FILE * fp, dict2pid_t * d2p, mdef_t * mdef, dict_t * dict)
{
    int32 w, p, pronlen;
    int32 i, j, b, l, r;

    fprintf(fp, "# INTERNAL (wd comssid ssid ssid ... ssid comssid)\n");
    for (w = 0; w < dict_size(dict); w++) {
        fprintf(fp, "%30s ", dict_wordstr(dict, w));

        pronlen = dict_pronlen(dict, w);
        for (p = 0; p < pronlen; p++)
            fprintf(fp, " %5d", d2p->internal[w][p]);
        fprintf(fp, "\n");
    }
    fprintf(fp, "#\n");

    fprintf(fp, "# LDIPH_LC (b r l ssid)\n");
    for (b = 0; b < mdef_n_ciphone(mdef); b++) {
        for (r = 0; r < mdef_n_ciphone(mdef); r++) {
            for (l = 0; l < mdef_n_ciphone(mdef); l++) {
                if (IS_S3SSID(d2p->ldiph_lc[b][r][l]))
                    fprintf(fp, "%6s %6s %6s %5d\n", mdef_ciphone_str(mdef, (s3cipid_t) b), mdef_ciphone_str(mdef, (s3cipid_t) r), mdef_ciphone_str(mdef, (s3cipid_t) l), d2p->ldiph_lc[b][r][l]);      /* RAH, ldiph_lc is returning an int32, %d expects an int16 */
            }
        }
    }
    fprintf(fp, "#\n");

    fprintf(fp, "# SINGLE_LC (b l comssid)\n");
    for (b = 0; b < mdef_n_ciphone(mdef); b++) {
        for (l = 0; l < mdef_n_ciphone(mdef); l++) {
            if (IS_S3SSID(d2p->single_lc[b][l]))
                fprintf(fp, "%6s %6s %5d\n", mdef_ciphone_str(mdef, (s3cipid_t) b), mdef_ciphone_str(mdef, (s3cipid_t) l), d2p->single_lc[b][l]);       /* RAH, single_lc is returning an int32, %d expects an int16 */
        }
    }
    fprintf(fp, "#\n");

    fprintf(fp, "# SSEQ %d (senid senid ...)\n", mdef->n_sseq);
    for (i = 0; i < mdef->n_sseq; i++) {
        fprintf(fp, "%5d ", i);
        for (j = 0; j < mdef_n_emit_state(mdef); j++)
            fprintf(fp, " %5d", mdef->sseq[i][j]);
        fprintf(fp, "\n");
    }
    fprintf(fp, "#\n");

    fprintf(fp, "# COMSSEQ %d (comstate comstate ...)\n", d2p->n_comsseq);
    for (i = 0; i < d2p->n_comsseq; i++) {
        fprintf(fp, "%5d ", i);
        for (j = 0; j < mdef_n_emit_state(mdef); j++)
            fprintf(fp, " %5d", d2p->comsseq[i][j]);
        fprintf(fp, "\n");
    }
    fprintf(fp, "#\n");

    fprintf(fp, "# COMSTATE %d (senid senid ...)\n", d2p->n_comstate);
    for (i = 0; i < d2p->n_comstate; i++) {
        fprintf(fp, "%5d ", i);
        for (j = 0; IS_S3SENID(d2p->comstate[i][j]); j++)
            fprintf(fp, " %5d", d2p->comstate[i][j]);
        fprintf(fp, "\n");
    }
    fprintf(fp, "#\n");
    fprintf(fp, "# END\n");

    fflush(fp);
}